

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool __thiscall
uWS::WebSocketProtocol<false>::consumeContinuation
          (WebSocketProtocol<false> *this,char **src,uint *length,void *user)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = this->remainingBytes;
  if (*length < uVar2) {
    uVar2 = uVar2 - *length;
    this->remainingBytes = uVar2;
    handleFragment(this,*src,(ulong)*length,uVar2,(uint)this->opCode[(byte)this->opStack],
                   this->lastFin != '\0',user);
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar1 = handleFragment(this,*src,(ulong)uVar2,0,(uint)this->opCode[(byte)this->opStack],
                           this->lastFin != '\0',user);
    if (!bVar1) {
      if (this->lastFin != '\0') {
        this->opStack = this->opStack + -1;
      }
      uVar2 = this->remainingBytes;
      *src = *src + uVar2;
      *length = *length - uVar2;
      this->state = '\0';
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }